

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_impl_ssse3.c
# Opt level: O2

void aom_var_filter_block2d_bil_second_pass_ssse3
               (uint16_t *a,uint8_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  undefined8 uVar1;
  ulong uVar2;
  uint3 uVar3;
  uint3 uVar4;
  uint uVar5;
  uint16_t *puVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar4 = CONCAT12((char)((ushort)*(undefined2 *)filter >> 8),*(undefined2 *)filter);
  uVar3 = uVar4 & 0xff00ff;
  auVar8[7] = 0;
  auVar8._0_7_ = CONCAT34(uVar4,(uint)uVar3) & 0xff00ffffffffff;
  auVar8._8_3_ = uVar3;
  auVar8[0xb] = 0;
  auVar8._12_3_ = uVar3;
  auVar8[0xf] = 0;
  for (uVar5 = 0; uVar5 != output_height; uVar5 = uVar5 + 1) {
    puVar6 = a + (src_pixels_per_line - output_width);
    for (lVar7 = 0; (uint)lVar7 < output_width; lVar7 = lVar7 + 4) {
      uVar1 = *(undefined8 *)(a + (ulong)pixel_step + lVar7);
      uVar2 = *(ulong *)(a + lVar7);
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar2;
      auVar11._12_2_ = (short)(uVar2 >> 0x30);
      auVar11._14_2_ = (short)((ulong)uVar1 >> 0x30);
      auVar10._12_4_ = auVar11._12_4_;
      auVar10._8_2_ = 0;
      auVar10._0_8_ = uVar2;
      auVar10._10_2_ = (short)((ulong)uVar1 >> 0x20);
      auVar9._10_6_ = auVar10._10_6_;
      auVar9._8_2_ = (short)(uVar2 >> 0x20);
      auVar9._0_8_ = uVar2;
      auVar12._8_8_ = auVar9._8_8_;
      auVar12._6_2_ = (short)((ulong)uVar1 >> 0x10);
      auVar12._4_2_ = (short)(uVar2 >> 0x10);
      auVar12._0_2_ = (undefined2)uVar2;
      auVar12._2_2_ = (short)uVar1;
      auVar12 = pmaddwd(auVar12,auVar8);
      auVar13._0_4_ = auVar12._0_4_ + 0x40U >> 7;
      auVar13._4_4_ = auVar12._4_4_ + 0x40U >> 7;
      auVar13._8_4_ = auVar12._8_4_ + 0x40U >> 7;
      auVar13._12_4_ = auVar12._12_4_ + 0x40U >> 7;
      auVar12 = pshufb(auVar13,ZEXT416(0xc080400));
      *(int *)(b + lVar7) = auVar12._0_4_;
      puVar6 = puVar6 + 4;
    }
    b = b + lVar7;
    a = puVar6;
  }
  return;
}

Assistant:

void aom_var_filter_block2d_bil_second_pass_ssse3(
    const uint16_t *a, uint8_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  const int16_t round = (1 << FILTER_BITS) >> 1;
  const __m128i r = _mm_set1_epi32(round);
  const __m128i filters =
      _mm_setr_epi16(filter[0], filter[1], filter[0], filter[1], filter[0],
                     filter[1], filter[0], filter[1]);
  const __m128i shuffle_mask =
      _mm_setr_epi8(0, 1, 8, 9, 2, 3, 10, 11, 4, 5, 12, 13, 6, 7, 14, 15);
  const __m128i mask =
      _mm_setr_epi8(0, 4, 8, 12, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1);
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; j += 4) {
      // load source as:
      // { a[0], a[1], a[2], a[3], a[w], a[w+1], a[w+2], a[w+3] }
      __m128i source1 = xx_loadl_64(a);
      __m128i source2 = xx_loadl_64(a + pixel_step);
      __m128i source = _mm_unpacklo_epi64(source1, source2);

      // shuffle source to:
      // { a[0], a[w], a[1], a[w+1], a[2], a[w+2], a[3], a[w+3] }
      __m128i source_shuffle = _mm_shuffle_epi8(source, shuffle_mask);

      // b[i] = a[i] * filter[0] + a[w + i] * filter[1]
      __m128i res = _mm_madd_epi16(source_shuffle, filters);

      // round
      res = _mm_srai_epi32(_mm_add_epi32(res, r), FILTER_BITS);

      // shuffle to get each lower 8 bit of every 32 bit
      res = _mm_shuffle_epi8(res, mask);

      xx_storel_32(b, res);

      a += 4;
      b += 4;
    }

    a += src_pixels_per_line - output_width;
  }
}